

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O2

vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
* __thiscall
anurbs::
CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
::derivatives_at(vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 *__return_storage_ptr__,
                CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
                *this,double t,Index order)

{
  element_type *peVar1;
  long lVar2;
  Index i;
  long __args;
  function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> c;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  surface_derivatives;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  curve_derivatives;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  _Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  local_78;
  _Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  local_60;
  anon_class_24_3_7c38b2f8 local_48;
  
  (*(((this->m_curve_geometry).
      super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_CurveBase<2L>)._vptr_CurveBase[6])(SUB84(t,0),&local_60);
  peVar1 = (this->m_surface_geometry).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_SurfaceBase<3L>)._vptr_SurfaceBase[7])
            (SUB84(((local_60._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
                   array[0],0),
             ((local_60._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array[1]
             ,&local_78,peVar1,order);
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::vector(__return_storage_ptr__,order + 1,(allocator_type *)local_98._M_pod_data);
  local_88 = 0;
  uStack_80 = 0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_48.c = (function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> *)&local_98;
  local_48.curve_derivatives =
       (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        *)&local_60;
  local_48.surface_derivatives =
       (vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        *)&local_78;
  std::function<Eigen::Matrix<double,1,3,1,1,3>(long,long,long)>::operator=
            ((function<Eigen::Matrix<double,1,3,1,1,3>(long,long,long)> *)local_98._M_pod_data,
             &local_48);
  lVar2 = 0;
  for (__args = 0; __args <= order; __args = __args + 1) {
    std::function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)>::operator()
              ((Matrix<double,_1,_3,_1,_1,_3> *)&local_48,
               (function<Eigen::Matrix<double,_1,_3,_1,_1,_3>_(long,_long,_long)> *)&local_98,__args
               ,0,0);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=
              ((Matrix<double,_1,_3,_1,_1,_3> *)
               ((long)(((__return_storage_ptr__->
                        super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
                      .array + lVar2),(Matrix<double,_1,_3,_1,_1,_3> *)&local_48);
    lVar2 = lVar2 + 0x18;
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::
  _Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::~_Vector_base(&local_78);
  std::
  _Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::~_Vector_base(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double t, const Index order)
        const override
    {
        // derivatives of base geometries

        const auto curve_derivatives =
            m_curve_geometry->derivatives_at(t, order);

        const double u = curve_derivatives[0][0];
        const double v = curve_derivatives[0][1];

        const auto surface_derivatives =
            m_surface_geometry->derivatives_at(u, v, order);

        // compute combined derivatives

        std::vector<Vector> derivatives(order + 1);

        std::function<Vector(Index, Index, Index)> c;

        c = [&](Index order, Index i, Index j) -> Vector {
            if (order > 0) {
                Vector result = Vector::Zero();

                for (Index a = 1; a <= order; a++) {
                    result += (
                        c(order - a, i + 1, j) * curve_derivatives[a][0] +
                        c(order - a, i, j + 1) * curve_derivatives[a][1]
                    ) * Math::binom(order - 1, a - 1);
                }

                return result;
            } else {
                const Index index = NurbsSurfaceShapeFunction::shape_index(i, j);
                return surface_derivatives[index];
            }
        };

        for (Index i = 0; i <= order; i++) {
            derivatives[i] = c(i, 0, 0);
        }

        return derivatives;
    }